

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaTypePtr
xmlSchemaParseComplexType
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int topLevel)

{
  int *flags;
  byte *pbVar1;
  uint uVar2;
  _xmlAttr *p_Var3;
  bool bVar4;
  int iVar5;
  xmlAttrPtr pxVar6;
  xmlSchemaTypePtr pxVar7;
  undefined8 uVar8;
  xmlSchemaAnnotPtr pxVar9;
  xmlSchemaTypePtr pxVar10;
  xmlSchemaWildcardPtr pxVar11;
  xmlSchemaTypeType xVar12;
  undefined4 in_register_0000000c;
  xmlNodePtr pxVar13;
  xmlNs *pxVar14;
  xmlNodePtr extraout_RDX;
  xmlChar *name_00;
  xmlNodePtr node_00;
  xmlNodePtr node_01;
  xmlNodePtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlSchemaBasicItemPtr extraout_RDX_05;
  xmlSchemaBasicItemPtr extraout_RDX_06;
  xmlSchemaBasicItemPtr pxVar15;
  xmlSchemaBasicItemPtr extraout_RDX_07;
  xmlSchemaBasicItemPtr extraout_RDX_08;
  xmlSchemaBasicItemPtr extraout_RDX_09;
  xmlChar **in_R8;
  char *type;
  char *in_R9;
  _xmlNode *node_02;
  _xmlNode *p_Var16;
  xmlNodePtr child;
  xmlChar *name;
  ulong in_stack_ffffffffffffff78;
  undefined4 uVar17;
  char *content;
  undefined8 in_stack_ffffffffffffff80;
  xmlNodePtr str1;
  xmlChar *local_58;
  xmlAttrPtr local_48;
  uint local_3c;
  xmlSchemaTypePtr local_38;
  
  uVar17 = (undefined4)(in_stack_ffffffffffffff78 >> 0x20);
  pxVar13 = (xmlNodePtr)CONCAT44(in_register_0000000c,topLevel);
  str1 = (xmlNodePtr)0x0;
  local_48 = (xmlAttrPtr)0x0;
  local_38 = ctxt->ctxtType;
  if (topLevel == 0) {
    content = (char *)(in_stack_ffffffffffffff78 & 0xffffffff00000000);
    pxVar6 = (xmlAttrPtr)0x0;
    pxVar7 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_COMPLEX,(xmlChar *)0x0,
                              ctxt->targetNamespace,node,0);
    if (pxVar7 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    local_48 = (xmlAttrPtr)pxVar7->name;
    pxVar7->node = node;
    pxVar7->type = XML_SCHEMA_TYPE_COMPLEX;
  }
  else {
    pxVar6 = xmlSchemaGetPropNode(node,"name");
    if (pxVar6 == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1c9054,pxVar13,(char *)in_R8,
                 in_R9);
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar7 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    iVar5 = xmlSchemaPValAttrNode
                      (ctxt,(xmlSchemaBasicItemPtr)pxVar6,(xmlAttrPtr)pxVar7,
                       (xmlSchemaTypePtr)&local_48,in_R8);
    if (iVar5 != 0) {
      return (xmlSchemaTypePtr)0x0;
    }
    content = (char *)CONCAT44(uVar17,1);
    pxVar6 = local_48;
    pxVar7 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_COMPLEX,(xmlChar *)local_48,
                              ctxt->targetNamespace,node,1);
    if (pxVar7 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar7->node = node;
    pxVar7->type = XML_SCHEMA_TYPE_COMPLEX;
    *(byte *)&pxVar7->flags = (byte)pxVar7->flags | 8;
  }
  pxVar7->targetNamespace = ctxt->targetNamespace;
  p_Var16 = (_xmlNode *)node->properties;
  if (p_Var16 != (_xmlNode *)0x0) {
    flags = &pxVar7->flags;
    bVar4 = false;
    uVar8 = CONCAT71((int7)((ulong)flags >> 8),1);
LAB_00193bec:
    local_3c = (uint)uVar8;
    do {
      if (p_Var16->ns == (xmlNs *)0x0) {
        iVar5 = xmlStrEqual(p_Var16->name,"id");
        if (iVar5 == 0) {
          iVar5 = xmlStrEqual(p_Var16->name,(xmlChar *)"mixed");
          if (iVar5 == 0) {
            pxVar13 = node_00;
            if (topLevel == 0) goto LAB_00193c09;
            iVar5 = xmlStrEqual(p_Var16->name,"name");
            if (iVar5 == 0) {
              iVar5 = xmlStrEqual(p_Var16->name,"abstract");
              if (iVar5 == 0) {
                iVar5 = xmlStrEqual(p_Var16->name,(xmlChar *)"final");
                if (iVar5 == 0) {
                  iVar5 = xmlStrEqual(p_Var16->name,(xmlChar *)"block");
                  pxVar13 = extraout_RDX_00;
                  if (iVar5 == 0) goto LAB_00193c09;
                  local_58 = xmlSchemaGetNodeContent(ctxt,p_Var16);
                  content = (char *)CONCAT44((int)((ulong)content >> 0x20),0xffffffff);
                  pxVar6 = (xmlAttrPtr)0x80000;
                  iVar5 = xmlSchemaPValAttrBlockFinal
                                    (local_58,flags,0x40000,0x80000,-1,-1,-1,
                                     (int)in_stack_ffffffffffffff80);
                  if (iVar5 == 0) goto LAB_00193dba;
                  type = "(#all | List of (extension | restriction)) ";
                }
                else {
                  local_58 = xmlSchemaGetNodeContent(ctxt,p_Var16);
                  content = (char *)CONCAT44((int)((ulong)content >> 0x20),0xffffffff);
                  pxVar6 = (xmlAttrPtr)0x400;
                  iVar5 = xmlSchemaPValAttrBlockFinal
                                    (local_58,flags,0x200,0x400,-1,-1,-1,
                                     (int)in_stack_ffffffffffffff80);
                  if (iVar5 == 0) {
                    bVar4 = true;
                    goto LAB_00193c31;
                  }
                  type = "(#all | List of (extension | restriction))";
                }
                in_stack_ffffffffffffff80 = 0;
                content = (char *)0x0;
                pxVar6 = (xmlAttrPtr)0x0;
                xmlSchemaPSimpleTypeErr
                          (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)p_Var16,
                           (xmlNodePtr)0x0,(xmlSchemaTypePtr)type,(char *)local_58,(xmlChar *)0x0,
                           (char *)0x0,(xmlChar *)str1,(xmlChar *)schema);
              }
              else {
                iVar5 = xmlSchemaPGetBoolNodeValue(ctxt,(xmlSchemaBasicItemPtr)p_Var16,node_01);
                if (iVar5 != 0) {
                  pbVar1 = (byte *)((long)&pxVar7->flags + 2);
                  *pbVar1 = *pbVar1 | 0x10;
                }
              }
            }
          }
          else {
            iVar5 = xmlSchemaPGetBoolNodeValue(ctxt,(xmlSchemaBasicItemPtr)p_Var16,node_00);
            if (iVar5 != 0) {
              *(byte *)flags = (byte)*flags | 1;
            }
          }
        }
        else {
          xmlSchemaPValAttrID(ctxt,node,name_00);
        }
      }
      else {
        iVar5 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        pxVar13 = extraout_RDX;
        if (iVar5 != 0) {
LAB_00193c09:
          xmlSchemaPIllegalAttrErr
                    (ctxt,(xmlParserErrors)p_Var16,(xmlSchemaBasicItemPtr)pxVar13,pxVar6);
        }
      }
LAB_00193c31:
      p_Var16 = p_Var16->next;
      if (p_Var16 == (_xmlNode *)0x0) {
        bVar4 = !bVar4;
        if ((local_3c & 1) != 0) goto LAB_00193e09;
        goto LAB_00193e1e;
      }
    } while( true );
  }
  bVar4 = true;
LAB_00193e09:
  uVar2 = schema->flags;
  if ((char)uVar2 < '\0') {
    pbVar1 = (byte *)((long)&pxVar7->flags + 2);
    *pbVar1 = *pbVar1 | 8;
  }
  if ((uVar2 & 0x40) != 0) {
    pbVar1 = (byte *)((long)&pxVar7->flags + 2);
    *pbVar1 = *pbVar1 | 4;
  }
LAB_00193e1e:
  if (bVar4) goto LAB_00193e22;
LAB_00193e36:
  pxVar13 = node->children;
  p_Var16 = pxVar13;
  if (pxVar13 == (xmlNodePtr)0x0) {
    ctxt->ctxtType = pxVar7;
LAB_00193f6e:
    bVar4 = true;
    pxVar13 = (xmlNodePtr)0x0;
LAB_0019420e:
    pxVar10 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
    pxVar7->baseType = pxVar10;
    *(byte *)&pxVar7->flags = (byte)pxVar7->flags | 4;
    if ((!bVar4) && (pxVar13->ns != (xmlNs *)0x0)) {
      iVar5 = xmlStrEqual(pxVar13->name,"all");
      pxVar14 = pxVar13->ns;
      if (iVar5 == 0) {
LAB_001942b8:
        if (pxVar14 != (xmlNs *)0x0) {
          iVar5 = xmlStrEqual(pxVar13->name,(xmlChar *)"choice");
          pxVar14 = pxVar13->ns;
          if (iVar5 != 0) {
            iVar5 = xmlStrEqual(pxVar14->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
            if (iVar5 != 0) {
              xVar12 = XML_SCHEMA_TYPE_CHOICE;
              goto LAB_001943aa;
            }
            pxVar14 = pxVar13->ns;
          }
          if (pxVar14 != (xmlNs *)0x0) {
            iVar5 = xmlStrEqual(pxVar13->name,(xmlChar *)"sequence");
            pxVar14 = pxVar13->ns;
            if (iVar5 != 0) {
              iVar5 = xmlStrEqual(pxVar14->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
              if (iVar5 != 0) {
                xVar12 = XML_SCHEMA_TYPE_SEQUENCE;
                goto LAB_001943aa;
              }
              pxVar14 = pxVar13->ns;
            }
            if (((pxVar14 != (xmlNs *)0x0) &&
                (iVar5 = xmlStrEqual(pxVar13->name,"group"), iVar5 != 0)) &&
               (iVar5 = xmlStrEqual(pxVar13->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema")
               , iVar5 != 0)) {
              pxVar10 = (xmlSchemaTypePtr)xmlSchemaParseModelGroupDefRef(ctxt,schema,pxVar13);
              goto LAB_001943b5;
            }
          }
        }
      }
      else {
        iVar5 = xmlStrEqual(pxVar14->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        if (iVar5 == 0) {
          pxVar14 = pxVar13->ns;
          goto LAB_001942b8;
        }
        xVar12 = XML_SCHEMA_TYPE_ALL;
LAB_001943aa:
        pxVar10 = (xmlSchemaTypePtr)xmlSchemaParseModelGroup(ctxt,schema,pxVar13,xVar12,1);
LAB_001943b5:
        pxVar7->subtypes = pxVar10;
        p_Var16 = pxVar13->next;
      }
    }
    bVar4 = false;
    iVar5 = xmlSchemaParseLocalAttributes
                      (ctxt,schema,(xmlNodePtr *)&stack0xffffffffffffff88,
                       (xmlSchemaItemListPtr *)&pxVar7->attrUses,0xc,(int *)0x0);
    if (iVar5 == -1) {
      return (xmlSchemaTypePtr)0x0;
    }
    if (p_Var16 == (xmlNodePtr)0x0) goto LAB_00194515;
    bVar4 = false;
    if (((p_Var16->ns != (xmlNs *)0x0) &&
        (iVar5 = xmlStrEqual(p_Var16->name,(xmlChar *)"anyAttribute"), iVar5 != 0)) &&
       (iVar5 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar5 != 0)) {
      pxVar11 = xmlSchemaParseAnyAttribute(ctxt,schema,p_Var16);
      pxVar7->attributeWildcard = pxVar11;
      p_Var16 = p_Var16->next;
      bVar4 = false;
      goto LAB_001944f3;
    }
  }
  else {
    if (((pxVar13->ns == (xmlNs *)0x0) ||
        (iVar5 = xmlStrEqual(pxVar13->name,(xmlChar *)"annotation"), iVar5 == 0)) ||
       (iVar5 = xmlStrEqual(pxVar13->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar5 == 0)) {
      ctxt->ctxtType = pxVar7;
    }
    else {
      pxVar9 = xmlSchemaParseAnnotation(ctxt,pxVar13,1);
      pxVar7->annot = pxVar9;
      pxVar13 = pxVar13->next;
      ctxt->ctxtType = pxVar7;
      p_Var16 = pxVar13;
      if (pxVar13 == (xmlNodePtr)0x0) goto LAB_00193f6e;
    }
    if (pxVar13->ns == (xmlNs *)0x0) {
LAB_0019420b:
      bVar4 = false;
      goto LAB_0019420e;
    }
    iVar5 = xmlStrEqual(pxVar13->name,(xmlChar *)"simpleContent");
    pxVar6 = (xmlAttrPtr)pxVar13->ns;
    if (iVar5 == 0) {
LAB_00194050:
      if (((pxVar6 == (xmlAttrPtr)0x0) ||
          (iVar5 = xmlStrEqual(pxVar13->name,(xmlChar *)"complexContent"), iVar5 == 0)) ||
         (iVar5 = xmlStrEqual(pxVar13->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar5 == 0)) goto LAB_0019420b;
      pxVar7->contentType = XML_SCHEMA_CONTENT_EMPTY;
      pxVar10 = ctxt->ctxtType;
      pxVar15 = extraout_RDX_05;
      for (p_Var3 = pxVar13->properties; p_Var3 != (_xmlAttr *)0x0; p_Var3 = p_Var3->next) {
        if (p_Var3->ns == (xmlNs *)0x0) {
          iVar5 = xmlStrEqual(p_Var3->name,"id");
          pxVar15 = extraout_RDX_08;
          if ((iVar5 == 0) &&
             (iVar5 = xmlStrEqual(p_Var3->name,(xmlChar *)"mixed"), pxVar15 = extraout_RDX_09,
             iVar5 == 0)) goto LAB_001940ca;
        }
        else {
          iVar5 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar15 = extraout_RDX_06;
          if (iVar5 != 0) {
LAB_001940ca:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar15,pxVar6);
            pxVar15 = extraout_RDX_07;
          }
        }
      }
      iVar5 = (int)pxVar6;
      xmlSchemaPValAttrID(ctxt,pxVar13,(xmlChar *)pxVar15);
      iVar5 = xmlGetBooleanProp(ctxt,pxVar13,"mixed",iVar5);
      if ((iVar5 != 0) && ((pxVar10->flags & 1U) == 0)) {
        pxVar10->flags = pxVar10->flags | 1;
      }
      node_02 = pxVar13->children;
      if (node_02 != (xmlNodePtr)0x0) {
        if (((node_02->ns != (xmlNs *)0x0) &&
            (iVar5 = xmlStrEqual(node_02->name,(xmlChar *)"annotation"), iVar5 != 0)) &&
           (iVar5 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar5 != 0)) {
          pxVar9 = xmlSchemaParseAnnotation(ctxt,node_02,1);
          xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)pxVar10,pxVar9);
          node_02 = node_02->next;
          if (node_02 == (xmlNodePtr)0x0) goto LAB_00194275;
        }
        bVar4 = false;
        if (node_02->ns != (xmlNs *)0x0) {
          iVar5 = xmlStrEqual(node_02->name,(xmlChar *)"restriction");
          if ((iVar5 != 0) &&
             (iVar5 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar5 != 0)) {
            xVar12 = XML_SCHEMA_TYPE_COMPLEX_CONTENT;
            goto LAB_00194201;
          }
          if (((node_02->ns != (xmlNs *)0x0) &&
              (iVar5 = xmlStrEqual(node_02->name,(xmlChar *)"extension"), iVar5 != 0)) &&
             (iVar5 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar5 != 0)) {
            xVar12 = XML_SCHEMA_TYPE_COMPLEX_CONTENT;
            goto LAB_001944b3;
          }
        }
        goto LAB_001944c8;
      }
LAB_00194275:
      bVar4 = false;
      xmlSchemaPContentErr
                (ctxt,XML_SCHEMAP_S4S_ELEM_MISSING,(xmlSchemaBasicItemPtr)pxVar13,(xmlNodePtr)0x0,
                 (xmlNodePtr)0x0,"(annotation?, (restriction | extension))",content);
      xmlSchemaPContentErr
                (ctxt,XML_SCHEMAP_S4S_ELEM_MISSING,(xmlSchemaBasicItemPtr)pxVar13,(xmlNodePtr)0x0,
                 (xmlNodePtr)0x0,"(annotation?, (restriction | extension))",content);
    }
    else {
      iVar5 = xmlStrEqual(pxVar6->name,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      if (iVar5 == 0) {
        pxVar6 = (xmlAttrPtr)pxVar13->ns;
        goto LAB_00194050;
      }
      if ((pxVar7->flags & 1U) != 0) {
        pxVar7->flags = pxVar7->flags & 0xfffffffe;
      }
      pxVar10 = ctxt->ctxtType;
      pxVar10->contentType = XML_SCHEMA_CONTENT_SIMPLE;
      pxVar15 = extraout_RDX_01;
      for (p_Var3 = pxVar13->properties; p_Var3 != (_xmlAttr *)0x0; p_Var3 = p_Var3->next) {
        if (p_Var3->ns == (xmlNs *)0x0) {
          iVar5 = xmlStrEqual(p_Var3->name,"id");
          pxVar15 = extraout_RDX_04;
          if (iVar5 == 0) goto LAB_00193f39;
        }
        else {
          iVar5 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar15 = extraout_RDX_02;
          if (iVar5 != 0) {
LAB_00193f39:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar15,pxVar6);
            pxVar15 = extraout_RDX_03;
          }
        }
      }
      xmlSchemaPValAttrID(ctxt,pxVar13,(xmlChar *)pxVar15);
      node_02 = pxVar13->children;
      if (node_02 == (xmlNodePtr)0x0) goto LAB_00194275;
      if (((node_02->ns != (xmlNs *)0x0) &&
          (iVar5 = xmlStrEqual(node_02->name,(xmlChar *)"annotation"), iVar5 != 0)) &&
         (iVar5 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar5 != 0)) {
        pxVar9 = xmlSchemaParseAnnotation(ctxt,node_02,1);
        xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)pxVar10,pxVar9);
        node_02 = node_02->next;
        if (node_02 == (xmlNodePtr)0x0) goto LAB_00194275;
      }
      bVar4 = false;
      if (node_02->ns != (xmlNs *)0x0) {
        iVar5 = xmlStrEqual(node_02->name,(xmlChar *)"restriction");
        if ((iVar5 == 0) ||
           (iVar5 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar5 == 0)) {
          if ((node_02->ns == (xmlNs *)0x0) ||
             ((iVar5 = xmlStrEqual(node_02->name,(xmlChar *)"extension"), iVar5 == 0 ||
              (iVar5 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              bVar4 = false, iVar5 == 0)))) goto LAB_001944c8;
          xVar12 = XML_SCHEMA_TYPE_SIMPLE_CONTENT;
LAB_001944b3:
          xmlSchemaParseExtension(ctxt,schema,node_02,xVar12);
        }
        else {
          xVar12 = XML_SCHEMA_TYPE_SIMPLE_CONTENT;
LAB_00194201:
          xmlSchemaParseRestriction(ctxt,schema,node_02,xVar12);
        }
        node_02 = node_02->next;
        bVar4 = true;
        if (node_02 == (_xmlNode *)0x0) goto LAB_001944ea;
      }
LAB_001944c8:
      xmlSchemaPContentErr
                (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)pxVar13,node_02,
                 (xmlNodePtr)0x0,"(annotation?, (restriction | extension))",content);
      pxVar13 = p_Var16;
    }
LAB_001944ea:
    p_Var16 = pxVar13->next;
LAB_001944f3:
    if (p_Var16 == (_xmlNode *)0x0) goto LAB_00194515;
  }
  xmlSchemaPContentErr
            (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,p_Var16,
             (xmlNodePtr)0x0,
             "(annotation?, (simpleContent | complexContent | ((group | all | choice | sequence)?, ((attribute | attributeGroup)*, anyAttribute?))))"
             ,content);
LAB_00194515:
  if (((topLevel != 0) && (!bVar4)) && (ctxt->isRedefine != 0)) {
    xmlSchemaPCustomErrExt
              (ctxt,XML_SCHEMAP_SRC_REDEFINE,(xmlSchemaBasicItemPtr)0x0,node,
               "This is a redefinition, thus the <complexType> must have a <restriction> or <extension> grand-child"
               ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  ctxt->ctxtType = local_38;
  return pxVar7;
LAB_00193dba:
  p_Var16 = p_Var16->next;
  uVar8 = 0;
  if (p_Var16 == (_xmlNode *)0x0) goto code_r0x00193dc9;
  goto LAB_00193bec;
code_r0x00193dc9:
  if (!bVar4) {
LAB_00193e22:
    uVar2 = schema->flags;
    if ((uVar2 & 8) != 0) {
      pbVar1 = (byte *)((long)&pxVar7->flags + 1);
      *pbVar1 = *pbVar1 | 4;
    }
    if ((uVar2 & 4) != 0) {
      pbVar1 = (byte *)((long)&pxVar7->flags + 1);
      *pbVar1 = *pbVar1 | 2;
    }
  }
  goto LAB_00193e36;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseComplexType(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                          xmlNodePtr node, int topLevel)
{
    xmlSchemaTypePtr type, ctxtType;
    xmlNodePtr child = NULL;
    const xmlChar *name = NULL;
    xmlAttrPtr attr;
    const xmlChar *attrValue;
#ifdef ENABLE_NAMED_LOCALS
    char buf[40];
#endif
    int final = 0, block = 0, hasRestrictionOrExtension = 0;


    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    ctxtType = ctxt->ctxtType;

    if (topLevel) {
	attr = xmlSchemaGetPropNode(node, "name");
	if (attr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING, NULL, node, "name", NULL);
	    return (NULL);
	} else if (xmlSchemaPValAttrNode(ctxt, NULL, attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	    return (NULL);
	}
    }

    if (topLevel == 0) {
	/*
	* Parse as local complex type definition.
	*/
#ifdef ENABLE_NAMED_LOCALS
        snprintf(buf, 39, "#CT%d", ctxt->counter++ + 1);
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    xmlDictLookup(ctxt->dict, (const xmlChar *)buf, -1),
	    ctxt->targetNamespace, node, 0);
#else
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    NULL, ctxt->targetNamespace, node, 0);
#endif
	if (type == NULL)
	    return (NULL);
	name = type->name;
	type->node = node;
	type->type = XML_SCHEMA_TYPE_COMPLEX;
	/*
	* TODO: We need the target namespace.
	*/
    } else {
	/*
	* Parse as global complex type definition.
	*/
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    name, ctxt->targetNamespace, node, 1);
	if (type == NULL)
	    return (NULL);
	type->node = node;
	type->type = XML_SCHEMA_TYPE_COMPLEX;
	type->flags |= XML_SCHEMAS_TYPE_GLOBAL;
    }
    type->targetNamespace = ctxt->targetNamespace;
    /*
    * Handle attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if (xmlStrEqual(attr->name, BAD_CAST "id")) {
		/*
		* Attribute "id".
		*/
		xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
	    } else if (xmlStrEqual(attr->name, BAD_CAST "mixed")) {
		/*
		* Attribute "mixed".
		*/
		if (xmlSchemaPGetBoolNodeValue(ctxt,
			NULL, (xmlNodePtr) attr))
		    type->flags |= XML_SCHEMAS_TYPE_MIXED;
	    } else if (topLevel) {
		/*
		* Attributes of global complex type definitions.
		*/
		if (xmlStrEqual(attr->name, BAD_CAST "name")) {
		    /* Pass. */
		} else if (xmlStrEqual(attr->name, BAD_CAST "abstract")) {
		    /*
		    * Attribute "abstract".
		    */
		    if (xmlSchemaPGetBoolNodeValue(ctxt,
			    NULL, (xmlNodePtr) attr))
			type->flags |= XML_SCHEMAS_TYPE_ABSTRACT;
		} else if (xmlStrEqual(attr->name, BAD_CAST "final")) {
		    /*
		    * Attribute "final".
		    */
		    attrValue = xmlSchemaGetNodeContent(ctxt,
			(xmlNodePtr) attr);
		    if (xmlSchemaPValAttrBlockFinal(attrValue,
			&(type->flags),
			-1,
			XML_SCHEMAS_TYPE_FINAL_EXTENSION,
			XML_SCHEMAS_TYPE_FINAL_RESTRICTION,
			-1, -1, -1) != 0)
		    {
			xmlSchemaPSimpleTypeErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			    NULL, (xmlNodePtr) attr, NULL,
			    "(#all | List of (extension | restriction))",
			    attrValue, NULL, NULL, NULL);
		    } else
			final = 1;
		} else if (xmlStrEqual(attr->name, BAD_CAST "block")) {
		    /*
		    * Attribute "block".
		    */
		    attrValue = xmlSchemaGetNodeContent(ctxt,
			(xmlNodePtr) attr);
		    if (xmlSchemaPValAttrBlockFinal(attrValue, &(type->flags),
			-1,
			XML_SCHEMAS_TYPE_BLOCK_EXTENSION,
			XML_SCHEMAS_TYPE_BLOCK_RESTRICTION,
			-1, -1, -1) != 0) {
			xmlSchemaPSimpleTypeErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			    NULL, (xmlNodePtr) attr, NULL,
			    "(#all | List of (extension | restriction)) ",
			    attrValue, NULL, NULL, NULL);
		    } else
			block = 1;
		} else {
			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    if (! block) {
	/*
	* Apply default "block" values.
	*/
	if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
	    type->flags |= XML_SCHEMAS_TYPE_BLOCK_RESTRICTION;
	if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
	    type->flags |= XML_SCHEMAS_TYPE_BLOCK_EXTENSION;
    }
    if (! final) {
	/*
	* Apply default "block" values.
	*/
	if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
	    type->flags |= XML_SCHEMAS_TYPE_FINAL_RESTRICTION;
	if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
	    type->flags |= XML_SCHEMAS_TYPE_FINAL_EXTENSION;
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        type->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    ctxt->ctxtType = type;
    if (IS_SCHEMA(child, "simpleContent")) {
	/*
	* <complexType><simpleContent>...
	* 3.4.3 : 2.2
	* Specifying mixed='true' when the <simpleContent>
	* alternative is chosen has no effect
	*/
	if (type->flags & XML_SCHEMAS_TYPE_MIXED)
	    type->flags ^= XML_SCHEMAS_TYPE_MIXED;
        xmlSchemaParseSimpleContent(ctxt, schema, child,
	    &hasRestrictionOrExtension);
        child = child->next;
    } else if (IS_SCHEMA(child, "complexContent")) {
	/*
	* <complexType><complexContent>...
	*/
	type->contentType = XML_SCHEMA_CONTENT_EMPTY;
        xmlSchemaParseComplexContent(ctxt, schema, child,
	    &hasRestrictionOrExtension);
        child = child->next;
    } else {
	/*
	* E.g <complexType><sequence>... or <complexType><attribute>... etc.
	*
	* SPEC
	* "...the third alternative (neither <simpleContent> nor
	* <complexContent>) is chosen. This case is understood as shorthand
	* for complex content restricting the `ur-type definition`, and the
	* details of the mappings should be modified as necessary.
	*/
	type->baseType = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
	type->flags |= XML_SCHEMAS_TYPE_DERIVATION_METHOD_RESTRICTION;
	/*
	* Parse model groups.
	*/
        if (IS_SCHEMA(child, "all")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_ALL, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "choice")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_CHOICE, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "sequence")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_SEQUENCE, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "group")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
	    /*
	    * Note that the reference will be resolved in
	    * xmlSchemaResolveTypeReferences();
	    */
            child = child->next;
        }
	/*
	* Parse attribute decls/refs.
	*/
        if (xmlSchemaParseLocalAttributes(ctxt, schema, &child,
	    (xmlSchemaItemListPtr *) &(type->attrUses),
	    XML_SCHEMA_TYPE_RESTRICTION, NULL) == -1)
	    return(NULL);
	/*
	* Parse attribute wildcard.
	*/
	if (IS_SCHEMA(child, "anyAttribute")) {
	    type->attributeWildcard = xmlSchemaParseAnyAttribute(ctxt, schema, child);
	    child = child->next;
	}
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child,
	    NULL, "(annotation?, (simpleContent | complexContent | "
	    "((group | all | choice | sequence)?, ((attribute | "
	    "attributeGroup)*, anyAttribute?))))");
    }
    /*
    * REDEFINE: SPEC src-redefine (5)
    */
    if (topLevel && ctxt->isRedefine && (! hasRestrictionOrExtension)) {
	xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
	    NULL, node, "This is a redefinition, thus the "
	    "<complexType> must have a <restriction> or <extension> "
	    "grand-child", NULL);
    }
    ctxt->ctxtType = ctxtType;
    return (type);
}